

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::_OnChangedVtxOffset(ImDrawList *this)

{
  ImVec4 IVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ImTextureID pvVar5;
  ImDrawCmd *pIVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ImDrawCmd *__dest;
  int iVar9;
  long lVar10;
  int iVar11;
  undefined1 in_ZMM1 [64];
  
  this->_VtxCurrentIdx = 0;
  pIVar6 = (this->CmdBuffer).Data;
  lVar10 = (long)(this->CmdBuffer).Size;
  if (pIVar6[lVar10 + -1].ElemCount != 0) {
    IVar1 = (this->_CmdHeader).ClipRect;
    auVar8 = vunpckhpd_avx((undefined1  [16])IVar1,ZEXT816(0) << 0x40);
    auVar8 = vcmpps_avx((undefined1  [16])IVar1,auVar8,2);
    auVar7 = vshufps_avx(auVar8,auVar8,0x50);
    auVar8 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
    if (((auVar8 & ~auVar7) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        -1 < SUB161(auVar8 & ~auVar7,0xf)) {
      pvVar5 = (this->_CmdHeader).TextureId;
      uVar2 = (this->_CmdHeader).VtxOffset;
      uVar3 = (this->IdxBuffer).Size;
      iVar11 = (this->CmdBuffer).Size;
      iVar4 = (this->CmdBuffer).Capacity;
      if (iVar11 == iVar4) {
        iVar11 = iVar11 + 1;
        if (iVar4 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar4 / 2 + iVar4;
        }
        if (iVar11 < iVar9) {
          iVar11 = iVar9;
        }
        if (iVar4 < iVar11) {
          __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar11 * 0x38);
          pIVar6 = (this->CmdBuffer).Data;
          if (pIVar6 != (ImDrawCmd *)0x0) {
            memcpy(__dest,pIVar6,(long)(this->CmdBuffer).Size * 0x38);
            ImGui::MemFree((this->CmdBuffer).Data);
          }
          (this->CmdBuffer).Data = __dest;
          (this->CmdBuffer).Capacity = iVar11;
        }
      }
      pIVar6 = (this->CmdBuffer).Data;
      iVar11 = (this->CmdBuffer).Size;
      pIVar6[iVar11].ClipRect = IVar1;
      pIVar6[iVar11].TextureId = pvVar5;
      pIVar6[iVar11].VtxOffset = uVar2;
      pIVar6[iVar11].IdxOffset = uVar3;
      *(undefined8 *)&pIVar6[iVar11].ElemCount = 0;
      *(ImDrawCallback *)(&pIVar6[iVar11].ElemCount + 2) = (ImDrawCallback)0x0;
      pIVar6[iVar11].UserCallbackData = (void *)0x0;
      (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
      return;
    }
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x1c1,"void ImDrawList::AddDrawCmd()");
  }
  if (pIVar6[lVar10 + -1].UserCallback == (ImDrawCallback)0x0) {
    pIVar6[lVar10 + -1].VtxOffset = (this->_CmdHeader).VtxOffset;
    return;
  }
  __assert_fail("curr_cmd->UserCallback == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                ,0x21d,"void ImDrawList::_OnChangedVtxOffset()");
}

Assistant:

void ImDrawList::_OnChangedVtxOffset()
{
    // We don't need to compare curr_cmd->VtxOffset != _CmdHeader.VtxOffset because we know it'll be different at the time we call this.
    _VtxCurrentIdx = 0;
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    //IM_ASSERT(curr_cmd->VtxOffset != _CmdHeader.VtxOffset); // See #3349
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    curr_cmd->VtxOffset = _CmdHeader.VtxOffset;
}